

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

CpuSet * ncnn::get_cpu_thread_affinity_mask(int powersave)

{
  uint in_EDI;
  CpuSet *local_8;
  
  try_initialize_global_cpu_info();
  if (in_EDI == 0) {
    local_8 = &g_cpu_affinity_mask_all;
  }
  else if (in_EDI == 1) {
    local_8 = &g_cpu_affinity_mask_little;
  }
  else if (in_EDI == 2) {
    local_8 = &g_cpu_affinity_mask_big;
  }
  else {
    fprintf(_stderr,"powersave %d not supported",(ulong)in_EDI);
    fprintf(_stderr,"\n");
    local_8 = &g_cpu_affinity_mask_all;
  }
  return local_8;
}

Assistant:

const CpuSet& get_cpu_thread_affinity_mask(int powersave)
{
    try_initialize_global_cpu_info();
    if (powersave == 0)
        return g_cpu_affinity_mask_all;

    if (powersave == 1)
        return g_cpu_affinity_mask_little;

    if (powersave == 2)
        return g_cpu_affinity_mask_big;

    NCNN_LOGE("powersave %d not supported", powersave);

    // fallback to all cores anyway
    return g_cpu_affinity_mask_all;
}